

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O1

IOTHUB_ACCOUNT_INFO_HANDLE
IoTHubAccount_Init_With_Config(IOTHUB_ACCOUNT_CONFIG *config,_Bool testingModules)

{
  int iVar1;
  int iVar2;
  IOTHUB_ACCOUNT_INFO *accountInfo;
  IOTHUB_PROVISIONED_DEVICE **__s;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  LOGGER_LOG p_Var6;
  char *pcVar7;
  IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle;
  IOTHUB_MESSAGING_HANDLE pIVar8;
  IOTHUB_REGISTRYMANAGER_HANDLE pIVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  int endHost;
  int beginHost;
  int local_50;
  int endIothub;
  int endName;
  int beginName;
  char *local_40;
  int beginIothub;
  
  if (config == (IOTHUB_ACCOUNT_CONFIG *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
    }
    pcVar3 = "[IoTHubAccount] invalid configuration (NULL)";
    iVar2 = 0x28a;
LAB_00119ee5:
    (*p_Var6)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
              ,"IoTHubAccount_Init_With_Config",iVar2,1,pcVar3);
    return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
  }
  accountInfo = (IOTHUB_ACCOUNT_INFO *)malloc(0xc0);
  if (accountInfo == (IOTHUB_ACCOUNT_INFO *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
    }
    pcVar3 = "[IoTHubAccount] Failed allocating IOTHUB_ACCOUNT_INFO.";
    iVar2 = 0x293;
    goto LAB_00119ee5;
  }
  memset(accountInfo,0,0xc0);
  sVar10 = config->number_of_sas_devices;
  sVar5 = sVar10 * 8;
  __s = (IOTHUB_PROVISIONED_DEVICE **)malloc(sVar5);
  accountInfo->sasDevices = __s;
  if (__s == (IOTHUB_PROVISIONED_DEVICE **)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011a245;
    pcVar3 = "[IoTHubAccount] Failed allocating array for SAS devices";
    iVar2 = 0x29e;
  }
  else {
    accountInfo->number_of_sas_devices = sVar10;
    memset(__s,0,sVar5);
    pcVar3 = getenv("IOTHUB_CONNECTION_STRING");
    accountInfo->connString = pcVar3;
    pcVar4 = getenv("IOTHUB_EVENTHUB_CONNECTION_STRING");
    accountInfo->eventhubConnString = pcVar4;
    getenv("IOTHUB_E2E_X509_CERT_BASE64");
    getenv("IOTHUB_E2E_X509_PRIVATE_KEY_BASE64");
    getenv("IOTHUB_E2E_X509_THUMBPRINT");
    if (pcVar3 == (char *)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011a245;
      pcVar3 = "Failure retrieving IoT Hub connection string from the environment.\r\n";
      iVar2 = 0x2b7;
    }
    else if (pcVar4 == (char *)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011a245;
      pcVar3 = "Failure retrieving Event Hub connection string from the environment.\r\n";
      iVar2 = 0x2bd;
    }
    else {
      sVar5 = strlen(pcVar3);
      iVar1 = __isoc99_sscanf(pcVar3,
                              "HostName=%n%*[^.]%n.%n%*[^;];%nSharedAccessKeyName=%n%*[^;];%nSharedAccessKey=%n"
                              ,&beginHost,&endHost,&beginIothub,&endIothub,&beginName,&endName,
                              &local_50);
      iVar2 = beginHost;
      if (iVar1 == 0) {
        lVar11 = (long)endHost;
        lVar12 = (long)beginHost;
        pcVar3 = (char *)malloc((long)((endHost - beginHost) + 1));
        accountInfo->iothubName = pcVar3;
        if (pcVar3 == (char *)0x0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar3 = "Failure allocating iothubName.\r\n";
            iVar2 = 0x9f;
            goto LAB_00119e75;
          }
        }
        else {
          pcVar4 = (char *)malloc((long)((endIothub - iVar2) + 1));
          accountInfo->hostname = pcVar4;
          if (pcVar4 == (char *)0x0) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                        ,"retrieveConnStringInfo",0xa4,1,"Failure allocating hostname.\r\n");
            }
            pcVar3 = accountInfo->iothubName;
          }
          else {
            pcVar7 = (char *)malloc((long)((endName - beginName) + 1));
            accountInfo->keyName = pcVar7;
            if (pcVar7 == (char *)0x0) {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                          ,"retrieveConnStringInfo",0xaa,1,"Failure allocating keyname.\r\n");
              }
              pcVar3 = accountInfo->iothubName;
            }
            else {
              local_40 = pcVar7;
              pcVar7 = (char *)malloc((sVar5 - (long)local_50) + 2);
              accountInfo->sharedAccessKey = pcVar7;
              if (pcVar7 != (char *)0x0) {
                iVar2 = __isoc99_sscanf(accountInfo->connString,
                                        "HostName=%[^.].%[^;];SharedAccessKeyName=%[^;];SharedAccessKey=%s"
                                        ,pcVar3,pcVar4 + (lVar11 - lVar12) + 1,local_40,pcVar7);
                if (iVar2 == 4) {
                  strcpy(accountInfo->hostname,accountInfo->iothubName);
                  sVar10 = (long)endHost - (long)beginHost;
                  accountInfo->hostname[sVar10] = '.';
                  iVar2 = mallocAndStrcpy_s(&accountInfo->iothubSuffix,
                                            accountInfo->hostname +
                                            ((long)endHost - (long)beginHost) + 1);
                  if (iVar2 == 0) {
                    serviceClientHandle =
                         IoTHubServiceClientAuth_CreateFromConnectionString(accountInfo->connString)
                    ;
                    accountInfo->iothub_service_client_auth_handle = serviceClientHandle;
                    if (serviceClientHandle != (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0) {
                      pIVar8 = IoTHubMessaging_LL_Create(serviceClientHandle);
                      accountInfo->iothub_messaging_handle = pIVar8;
                      if (pIVar8 == (IOTHUB_MESSAGING_HANDLE)0x0) {
                        p_Var6 = xlogging_get_log_function();
                        if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011a380;
                        pcVar3 = "IoTHubMessaging_LL_Create failed\r\n";
                        iVar2 = 0x2fe;
                      }
                      else {
                        pIVar9 = IoTHubRegistryManager_Create
                                           (accountInfo->iothub_service_client_auth_handle);
                        accountInfo->iothub_registrymanager_handle = pIVar9;
                        if (pIVar9 == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) {
                          p_Var6 = xlogging_get_log_function();
                          if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011a380;
                          pcVar3 = "IoTHubRegistryManager_Create failed\r\n";
                          iVar2 = 0x307;
                        }
                        else {
                          iVar2 = provisionDevices(accountInfo,
                                                   (IOTHUB_ACCOUNT_AUTH_METHOD)
                                                   accountInfo->sasDevices,
                                                   (IOTHUB_PROVISIONED_DEVICE **)
                                                   accountInfo->number_of_sas_devices,sVar10);
                          if (iVar2 == 0) {
                            return accountInfo;
                          }
                          p_Var6 = xlogging_get_log_function();
                          if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011a380;
                          pcVar3 = "Failed to create the SAS device(s)\r\n";
                          iVar2 = 0x30f;
                        }
                      }
                      (*p_Var6)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                                ,"IoTHubAccount_Init_With_Config",iVar2,1,pcVar3);
LAB_0011a380:
                      IoTHubAccount_deinit(accountInfo);
                      return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
                    }
                    p_Var6 = xlogging_get_log_function();
                    if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011a245;
                    pcVar3 = "IoTHubServiceClientAuth_CreateFromConnectionString failed\r\n";
                    iVar2 = 0x2f5;
                    goto LAB_0011a23a;
                  }
                  p_Var6 = xlogging_get_log_function();
                  if (p_Var6 != (LOGGER_LOG)0x0) {
                    pcVar3 = "[IoTHubAccount] Failure constructing the iothubSuffix.";
                    iVar2 = 0xc9;
                    goto LAB_0011a1e2;
                  }
                }
                else {
                  p_Var6 = xlogging_get_log_function();
                  if (p_Var6 != (LOGGER_LOG)0x0) {
                    pcVar3 = "Failure determining the string values.\r\n";
                    iVar2 = 0xbc;
LAB_0011a1e2:
                    (*p_Var6)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                              ,"retrieveConnStringInfo",iVar2,1,pcVar3);
                  }
                }
                free(accountInfo->iothubName);
                free(accountInfo->hostname);
                free(accountInfo->keyName);
                pcVar3 = accountInfo->sharedAccessKey;
                goto LAB_0011a20c;
              }
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                          ,"retrieveConnStringInfo",0xb1,1,
                          "Failure allocating shared access key.\r\n");
              }
              free(accountInfo->iothubName);
              pcVar3 = accountInfo->keyName;
            }
            free(pcVar3);
            pcVar3 = accountInfo->hostname;
          }
LAB_0011a20c:
          free(pcVar3);
        }
      }
      else {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          pcVar3 = "Failure determining the string length parameters.\r\n";
          iVar2 = 0x98;
LAB_00119e75:
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
                    ,"retrieveConnStringInfo",iVar2,1,pcVar3);
        }
      }
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0011a245;
      pcVar3 = "retrieveConnStringInfo failed.\r\n";
      iVar2 = 0x2ec;
    }
  }
LAB_0011a23a:
  (*p_Var6)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
            ,"IoTHubAccount_Init_With_Config",iVar2,1,pcVar3);
LAB_0011a245:
  free(accountInfo);
  return (IOTHUB_ACCOUNT_INFO_HANDLE)0x0;
}

Assistant:

IOTHUB_ACCOUNT_INFO_HANDLE IoTHubAccount_Init_With_Config(IOTHUB_ACCOUNT_CONFIG* config, bool testingModules)
{
    (void)testingModules;
    IOTHUB_ACCOUNT_INFO* iothub_account_info;

    if (config == NULL)
    {
        LogError("[IoTHubAccount] invalid configuration (NULL)");
        iothub_account_info = NULL;
    }
    else
    {
        iothub_account_info = malloc(sizeof(IOTHUB_ACCOUNT_INFO));

        if (iothub_account_info == NULL)
        {
            LogError("[IoTHubAccount] Failed allocating IOTHUB_ACCOUNT_INFO.");
        }
        else
        {
            char* base64_cert;
            char* base64_key;
            char* tempThumb;
            memset(iothub_account_info, 0, sizeof(IOTHUB_ACCOUNT_INFO));

            if ((iothub_account_info->sasDevices = (IOTHUB_PROVISIONED_DEVICE**)malloc(sizeof(IOTHUB_PROVISIONED_DEVICE*) * config->number_of_sas_devices)) == NULL)
            {
                LogError("[IoTHubAccount] Failed allocating array for SAS devices");
                free(iothub_account_info);
                iothub_account_info = NULL;
            }
            else
            {
                iothub_account_info->number_of_sas_devices = config->number_of_sas_devices;
                memset(iothub_account_info->sasDevices, 0, sizeof(IOTHUB_PROVISIONED_DEVICE*) * iothub_account_info->number_of_sas_devices);

#ifdef MBED_BUILD_TIMESTAMP
                iothub_account_info->connString = getMbedParameter("IOTHUB_CONNECTION_STRING");
                iothub_account_info->eventhubConnString = getMbedParameter("IOTHUB_EVENTHUB_CONNECTION_STRING");
                tempCert = getMbedParameter("IOTHUB_E2E_X509_CERT");
                tempKey = getMbedParameter("IOTHUB_E2E_X509_PRIVATE_KEY");
                tempThump = getMbedParameter("IOTHUB_E2E_X509_THUMBPRINT");
#else
                iothub_account_info->connString = getenv("IOTHUB_CONNECTION_STRING");
                iothub_account_info->eventhubConnString = getenv("IOTHUB_EVENTHUB_CONNECTION_STRING");
                base64_cert = getenv("IOTHUB_E2E_X509_CERT_BASE64");
                base64_key = getenv("IOTHUB_E2E_X509_PRIVATE_KEY_BASE64");
                tempThumb = getenv("IOTHUB_E2E_X509_THUMBPRINT");
#endif

                if (iothub_account_info->connString == NULL)
                {
                    LogError("Failure retrieving IoT Hub connection string from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (iothub_account_info->eventhubConnString == NULL)
                {
                    LogError("Failure retrieving Event Hub connection string from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                /*else if (base64_cert == NULL)
                {
                    LogError("Failure retrieving x509 certificate from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (base64_key == NULL)
                {
                    LogError("Failure retrieving x509 private key from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (tempThumb == NULL)
                {
                    LogError("Failure retrieving x509 certificate thumbprint from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if ((iothub_account_info->x509Certificate = convert_base64_to_string(base64_cert)) == NULL)
                {
                    LogError("Failure allocating x509 certificate from the environment.\r\n");
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if ((iothub_account_info->x509PrivateKey = convert_base64_to_string(base64_key)) == NULL)
                {
                    LogError("Failure allocating x509 key from the environment.\r\n");
                    free(iothub_account_info->x509Certificate);
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }
                else if (mallocAndStrcpy_s(&iothub_account_info->x509Thumbprint, tempThumb) != 0)
                {
                    LogError("Failure allocating x509 thumb print from the environment.\r\n");
                    free(iothub_account_info->x509Certificate);
                    free(iothub_account_info->x509PrivateKey);
                    free(iothub_account_info);
                    iothub_account_info = NULL;
                }*/
                else
                {
                    if (retrieveConnStringInfo(iothub_account_info) != 0)
                    {
                        LogError("retrieveConnStringInfo failed.\r\n");
                        free(iothub_account_info);
                        iothub_account_info = NULL;
                    }
                    else
                    {
                        iothub_account_info->iothub_service_client_auth_handle = IoTHubServiceClientAuth_CreateFromConnectionString(iothub_account_info->connString);
                        if (iothub_account_info->iothub_service_client_auth_handle == NULL)
                        {
                            LogError("IoTHubServiceClientAuth_CreateFromConnectionString failed\r\n");
                            free(iothub_account_info);
                            iothub_account_info = NULL;
                        }
                        else
                        {
                            iothub_account_info->iothub_messaging_handle = IoTHubMessaging_LL_Create(iothub_account_info->iothub_service_client_auth_handle);
                            if (iothub_account_info->iothub_messaging_handle == NULL)
                            {
                                LogError("IoTHubMessaging_LL_Create failed\r\n");
                                IoTHubAccount_deinit(iothub_account_info);
                                iothub_account_info = NULL;
                            }
                            else
                            {
                                iothub_account_info->iothub_registrymanager_handle = IoTHubRegistryManager_Create(iothub_account_info->iothub_service_client_auth_handle);
                                if (iothub_account_info->iothub_registrymanager_handle == NULL)
                                {
                                    LogError("IoTHubRegistryManager_Create failed\r\n");
                                    IoTHubAccount_deinit(iothub_account_info);
                                    iothub_account_info = NULL;
                                }
                                else
                                {
                                    if (provisionDevices(iothub_account_info, IOTHUB_ACCOUNT_AUTH_CONNSTRING, iothub_account_info->sasDevices, iothub_account_info->number_of_sas_devices) != 0)
                                    {
                                        LogError("Failed to create the SAS device(s)\r\n");
                                        IoTHubAccount_deinit(iothub_account_info);
                                        iothub_account_info = NULL;
                                    }
                                    //else if (provisionDevice(iothub_account_info, IOTHUB_ACCOUNT_AUTH_X509, &iothub_account_info->x509Device) != 0)
                                    //{
                                    //    LogError("Failed to create the X509 device\r\n");
                                    //    IoTHubAccount_deinit(iothub_account_info);
                                    //    iothub_account_info = NULL;
                                    //}
                                    //else if (testingModules && provisionModule(iothub_account_info, iothub_account_info->sasDevices[0]))
                                    //{
                                    //    LogError("Failed to create the module\r\n");
                                    //    IoTHubAccount_deinit(iothub_account_info);
                                    //    iothub_account_info = NULL;
                                    //}
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return (IOTHUB_ACCOUNT_INFO_HANDLE)iothub_account_info;
}